

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::PrecomputeInternalForceMatricesWeightsContInt
          (ChElementHexaANCF_3843 *this)

{
  undefined1 (*pauVar1) [64];
  double *pdVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double *pdVar11;
  undefined1 auVar12 [16];
  long lVar13;
  undefined1 (*pauVar14) [64];
  long lVar15;
  ulong uVar16;
  double *pdVar17;
  ActualDstType actualDst;
  long lVar18;
  ulong uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ChMatrix33<double> J_0xi;
  ChMatrixNM<double,_NSF,_3> SD_precompute_D;
  MatrixNx3c Sxi_D;
  assign_op<double,_double> local_aa1;
  ulong local_aa0;
  ulong local_a98;
  ulong local_a90;
  ChElementHexaANCF_3843 *local_a88;
  Matrix3xN *local_a80;
  ulong local_a78;
  ulong local_a70;
  double local_a68;
  double local_a60;
  double local_a58;
  MatrixNx3c *local_a50;
  SrcXprType local_a48;
  Matrix<double,_3,_3,_1,_3,_3> local_a40;
  MatrixNx3c *local_9e8;
  Matrix<double,_3,_3,_1,_3,_3> local_9e0;
  MatrixNx3c *local_998;
  Matrix<double,_3,_3,_1,_3,_3> *local_990;
  undefined8 local_988;
  Scalar local_980 [24];
  undefined1 local_8c0 [64];
  undefined1 auStack_880 [256];
  undefined1 auStack_780 [256];
  double local_680 [96];
  MatrixNx3c local_380;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)&this->m_SD,0x1800,0x20,0xc0);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_kGQ,0x40,0x40,1);
  lVar13 = *(long *)(DAT_00b6ab20 + 0x48);
  if (*(long *)(DAT_00b6ab20 + 0x50) != lVar13) {
    local_a80 = &this->m_ebar0;
    local_a98 = 0;
    lVar15 = *(long *)(DAT_00b6ab20 + 0x50);
    local_a88 = this;
    do {
      lVar20 = lVar13;
      local_a78 = local_a98;
      if (lVar15 != lVar13) {
        local_aa0 = 0;
        do {
          uVar19 = 0;
          uVar16 = lVar15 - lVar13 >> 3;
          local_a90 = local_aa0;
          do {
            lVar15 = *(long *)(static_tables_3843 + 0x48);
            local_a58 = *(double *)(lVar15 + local_a98 * 8);
            lVar20 = uVar16 * local_a98 + local_aa0;
            local_a60 = *(double *)(lVar15 + local_aa0 * 8);
            local_a68 = *(double *)(lVar15 + uVar19 * 8);
            local_a70 = uVar19;
            Calc_Sxi_D(this,&local_380,*(double *)(lVar13 + local_a98 * 8),
                       *(double *)(lVar13 + local_aa0 * 8),*(double *)(lVar13 + uVar19 * 8));
            local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] = 0.0;
            local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[0] = 0.0;
            local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[1] = 0.0;
            local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2] = 0.0;
            local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[3] = 0.0;
            local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[4] = 0.0;
            local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[5] = 0.0;
            local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[6] = 0.0;
            local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[7] = 0.0;
            local_980[0] = 1.0;
            Eigen::internal::
            generic_product_impl<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,3,0,32,3>,Eigen::DenseShape,Eigen::DenseShape,8>
            ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
                      (&local_a40,local_a80,&local_380,local_980);
            local_a50 = &local_380;
            local_a48.m_xpr = &local_a40;
            local_9e8 = &local_380;
            Eigen::internal::
            Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
            ::run(&local_9e0,&local_a48,&local_aa1);
            pauVar14 = &local_8c0;
            local_998 = local_9e8;
            local_988 = 3;
            auVar30 = *(undefined1 (*) [64])
                       (local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                       m_storage.m_data.array;
            auVar28 = *(undefined1 (*) [64])
                       ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                        m_storage.m_data.array + 8);
            auVar29 = *(undefined1 (*) [64])
                       ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                        m_storage.m_data.array + 0x10);
            auVar31 = *(undefined1 (*) [64])
                       ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                        m_storage.m_data.array + 0x18);
            auVar32 = *(undefined1 (*) [64])
                       ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                        m_storage.m_data.array + 0x20);
            auVar33 = *(undefined1 (*) [64])
                       ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                        m_storage.m_data.array + 0x40);
            auVar3 = *(undefined1 (*) [64])
                      ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                       m_storage.m_data.array + 0x28);
            auVar4 = *(undefined1 (*) [64])
                      ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                       m_storage.m_data.array + 0x48);
            auVar5 = *(undefined1 (*) [64])
                      ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                       m_storage.m_data.array + 0x30);
            auVar6 = *(undefined1 (*) [64])
                      ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                       m_storage.m_data.array + 0x50);
            auVar7 = *(undefined1 (*) [64])
                      ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                       m_storage.m_data.array + 0x38);
            auVar8 = *(undefined1 (*) [64])
                      ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                       m_storage.m_data.array + 0x58);
            lVar13 = 7;
            do {
              auVar21._8_8_ = 0;
              auVar21._0_8_ =
                   local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[lVar13 + 5];
              auVar22 = vbroadcastsd_avx512f(auVar21);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                             m_storage.m_data.array[lVar13 + 8];
              auVar23 = vbroadcastsd_avx512f(auVar9);
              auVar10._8_8_ = 0;
              auVar10._0_8_ =
                   local_9e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[lVar13 + -1];
              auVar24 = vbroadcastsd_avx512f(auVar10);
              lVar13 = lVar13 + 1;
              auVar25 = vmulpd_avx512f(auVar30,auVar22);
              auVar26 = vmulpd_avx512f(auVar28,auVar22);
              auVar27 = vmulpd_avx512f(auVar29,auVar22);
              auVar22 = vmulpd_avx512f(auVar31,auVar22);
              auVar25 = vfmadd231pd_avx512f(auVar25,auVar32,auVar23);
              auVar26 = vfmadd231pd_avx512f(auVar26,auVar3,auVar23);
              auVar27 = vfmadd231pd_avx512f(auVar27,auVar5,auVar23);
              auVar22 = vfmadd231pd_avx512f(auVar22,auVar7,auVar23);
              auVar23 = vfmadd231pd_avx512f(auVar25,auVar33,auVar24);
              auVar25 = vfmadd231pd_avx512f(auVar26,auVar4,auVar24);
              auVar26 = vfmadd231pd_avx512f(auVar27,auVar6,auVar24);
              auVar22 = vfmadd231pd_avx512f(auVar22,auVar8,auVar24);
              pauVar14[-3] = auVar23;
              pauVar14[-2] = auVar25;
              pauVar14[-1] = auVar26;
              *pauVar14 = auVar22;
              pauVar14 = pauVar14 + 4;
            } while (lVar13 != 10);
            pauVar14 = (undefined1 (*) [64])local_680;
            lVar13 = 0;
            do {
              pauVar1 = (undefined1 (*) [64])(local_980 + lVar13);
              lVar15 = lVar13 * 8;
              auVar30 = *(undefined1 (*) [64])(auStack_780 + lVar13 * 8);
              lVar13 = lVar13 + 8;
              vpermt2pd_avx512f(_DAT_0099e880,*(undefined1 (*) [64])(auStack_880 + lVar15));
              vpermt2pd_avx512f(_DAT_0099e900,*(undefined1 (*) [64])(auStack_880 + lVar15));
              vpermt2pd_avx512f(_DAT_0099e980,*pauVar1);
              auVar28 = vpermt2pd_avx512f(_DAT_0099e8c0,auVar30);
              auVar29 = vpermt2pd_avx512f(_DAT_0099e940,auVar30);
              auVar30 = vpermt2pd_avx512f(_DAT_0099e9c0,auVar30);
              pauVar14[2] = auVar30;
              pauVar14[1] = auVar29;
              *pauVar14 = auVar28;
              pauVar14 = pauVar14 + 3;
            } while (lVar13 != 0x20);
            lVar13 = lVar20 * uVar16 + uVar19;
            local_990 = &local_9e0;
            if ((lVar13 < 0) ||
               (lVar15 = (local_a88->m_kGQ).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols * (local_a88->m_kGQ).
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_rows, lVar15 - lVar13 == 0 || lVar15 < lVar13)) {
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                           );
            }
            auVar40._8_8_ = 0;
            auVar40._0_8_ =
                 local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[7];
            auVar34._8_8_ = 0;
            auVar34._0_8_ =
                 local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[3];
            auVar36._8_8_ = 0;
            auVar36._0_8_ =
                 local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[4];
            auVar38._8_8_ = 0;
            auVar38._0_8_ =
                 local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[8];
            auVar41._8_8_ = 0;
            auVar41._0_8_ =
                 local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[7] *
                 local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[5];
            auVar21 = vfmsub231sd_fma(auVar41,auVar36,auVar38);
            auVar39._8_8_ = 0;
            auVar39._0_8_ =
                 local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[6] *
                 local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[5];
            auVar9 = vfmsub231sd_fma(auVar39,auVar34,auVar38);
            auVar37._8_8_ = 0;
            auVar37._0_8_ =
                 local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[6] *
                 local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[4];
            auVar10 = vfmsub231sd_fma(auVar37,auVar34,auVar40);
            auVar12._8_8_ = 0x8000000000000000;
            auVar12._0_8_ = 0x8000000000000000;
            auVar35._8_8_ = 0;
            auVar35._0_8_ =
                 auVar10._0_8_ *
                 local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[2] +
                 (auVar21._0_8_ *
                  local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[0] -
                 auVar9._0_8_ *
                 local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[1]);
            auVar21 = vxorpd_avx512vl(auVar35,auVar12);
            (local_a88->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data[lVar13] = local_a60 * local_a58 * local_a68 * auVar21._0_8_;
            pdVar11 = (local_a88->m_SD).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_data;
            lVar15 = (local_a88->m_SD).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_rows;
            if (lVar15 < 0 && pdVar11 != (double *)0x0) {
              __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                            ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                            "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
                           );
            }
            lVar20 = (local_a88->m_SD).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_cols;
            if (lVar20 <= lVar13) {
LAB_006fe5cb:
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                           );
            }
            if (lVar15 != 0x20) {
              __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                            "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
                           );
            }
            lVar18 = 0;
            lVar15 = (local_a78 * uVar16 + local_a90) * uVar16 + local_a70;
            pdVar17 = pdVar11 + lVar15;
            do {
              pdVar2 = (double *)((long)local_680 + lVar18);
              lVar18 = lVar18 + 0x18;
              *pdVar17 = *pdVar2;
              pdVar17 = pdVar17 + lVar20;
            } while (lVar18 != 0x300);
            auVar30 = vbroadcastsd_avx512f(ZEXT816(0x18));
            auVar28 = vbroadcastsd_avx512f(ZEXT816(8));
            if ((lVar13 + 0x40 < 0) ||
               (lVar20 = (local_a88->m_SD).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                         m_cols, lVar20 <= lVar13 + 0x40)) goto LAB_006fe5cb;
            pdVar17 = pdVar11 + lVar15 + 0x40;
            lVar15 = 8;
            do {
              pdVar2 = (double *)((long)local_680 + lVar15);
              lVar15 = lVar15 + 0x18;
              *pdVar17 = *pdVar2;
              pdVar17 = pdVar17 + lVar20;
            } while (lVar15 != 0x308);
            if ((lVar13 + 0x80 < 0) ||
               ((local_a88->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_cols <= lVar13 + 0x80)) goto LAB_006fe5cb;
            auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar31 = vpbroadcastq_avx512f();
            lVar15 = 0x20;
            do {
              vpmullq_avx512dq(auVar29,auVar30);
              auVar32 = vpmullq_avx512dq(auVar29,auVar31);
              auVar29 = vpaddq_avx512f(auVar29,auVar28);
              lVar15 = lVar15 + -8;
              auVar33 = vgatherqpd_avx512f(*(undefined8 *)
                                            ((long)&(local_a88->super_ChElementGeneric).
                                                    super_ChElementBase._vptr_ChElementBase +
                                            (long)(local_680 + 1)));
              vscatterqpd_avx512f(ZEXT864(pdVar11 + lVar13 + 0x80) + auVar32 * (undefined1  [64])0x8
                                  ,0xffff,auVar33);
            } while (lVar15 != 0);
            uVar19 = (ulong)((int)local_a70 + 1);
            lVar15 = *(long *)(DAT_00b6ab20 + 0x50);
            lVar13 = *(long *)(DAT_00b6ab20 + 0x48);
            uVar16 = lVar15 - lVar13 >> 3;
            this = local_a88;
          } while (uVar19 < uVar16);
          local_aa0 = (ulong)((int)local_a90 + 1);
        } while ((local_aa0 < uVar16) && (lVar15 != lVar13));
        lVar13 = *(long *)(DAT_00b6ab20 + 0x48);
        lVar20 = *(long *)(DAT_00b6ab20 + 0x50);
      }
      local_a98 = (ulong)((int)local_a78 + 1);
      lVar15 = lVar20;
    } while (local_a98 < (ulong)(lVar20 - lVar13 >> 3));
  }
  return;
}

Assistant:

void ChElementHexaANCF_3843::PrecomputeInternalForceMatricesWeightsContInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta_zeta = NP - 1;  // Gauss-Quadrature table index for xi, eta, and zeta

    m_SD.resize(NSF, 3 * NIP);
    m_kGQ.resize(NIP, 1);

    ChMatrixNM<double, NSF, 3> SD_precompute_D;

    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi_eta_zeta][it_xi] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_xi];
                double eta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_zeta];
                auto index =
                    it_zeta + it_eta * GQTable->Lroots[GQ_idx_xi_eta_zeta].size() +
                    it_xi * GQTable->Lroots[GQ_idx_xi_eta_zeta].size() * GQTable->Lroots[GQ_idx_xi_eta_zeta].size();
                ChMatrix33<double>
                    J_0xi;         // Element Jacobian between the reference configuration and normalized configuration
                MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                Calc_Sxi_D(Sxi_D, xi, eta, zeta);
                J_0xi.noalias() = m_ebar0 * Sxi_D;

                // Adjust the shape function derivative matrix to account for a potentially deformed reference state
                SD_precompute_D = Sxi_D * J_0xi.inverse();
                m_kGQ(index) = -J_0xi.determinant() * GQ_weight;

                // Group all of the columns together in blocks across the entire element
                m_SD.col(index) = SD_precompute_D.col(0);
                m_SD.col(index + NIP) = SD_precompute_D.col(1);
                m_SD.col(index + 2 * NIP) = SD_precompute_D.col(2);

                index++;
            }
        }
    }
}